

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O0

Point2f __thiscall pbrt::SobolSampler::Get2D(SobolSampler *this)

{
  int iVar1;
  float *pfVar2;
  int *piVar3;
  StatRegisterer *in_RDI;
  long *in_FS_OFFSET;
  float fVar4;
  int unaff_retaddr;
  SobolSampler *in_stack_00000008;
  int dim;
  Point2f u;
  float in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  _lambda_pbrt__StatsAccumulator___2_ local_25 [5];
  PixelAccumFunc in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  int i;
  StatRegisterer *this_00;
  Tuple2<pbrt::Point2,_float> local_8;
  
  if (0x3ff < *(int *)(in_RDI + 0x14) + 1) {
    *(undefined4 *)(in_RDI + 0x14) = 2;
  }
  this_00 = in_RDI;
  sampleDimension(in_stack_00000008,unaff_retaddr);
  sampleDimension(in_stack_00000008,unaff_retaddr);
  Point2<float>::Point2
            ((Point2<float> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  if (*(int *)(in_RDI + 0x14) == 0) {
    for (i = 0; i < 2; i = i + 1) {
      pfVar2 = Tuple2<pbrt::Point2,_float>::operator[](&local_8,i);
      fVar4 = *pfVar2;
      iVar1 = *(int *)(in_RDI + 4);
      pfVar2 = Tuple2<pbrt::Point2,_float>::operator[](&local_8,i);
      *pfVar2 = fVar4 * (float)iVar1;
      if ((Get2D()::reg == '\0') && (iVar1 = __cxa_guard_acquire(&Get2D()::reg), iVar1 != 0)) {
        Get2D()::{lambda(pbrt::StatsAccumulator&)#1}::operator_cast_to_function_pointer
                  ((_lambda_pbrt__StatsAccumulator___1_ *)&stack0xffffffffffffffeb);
        StatRegisterer::StatRegisterer
                  (this_00,(AccumFunc)CONCAT44(i,in_stack_ffffffffffffffe8),
                   in_stack_ffffffffffffffe0);
        __cxa_guard_release(&Get2D()::reg);
      }
      *(long *)(*in_FS_OFFSET + -0x3c0) = *(long *)(*in_FS_OFFSET + -0x3c0) + 1;
      pfVar2 = Tuple2<pbrt::Point2,_float>::operator[](&local_8,i);
      fVar4 = *pfVar2;
      piVar3 = Tuple2<pbrt::Point2,_int>::operator[]((Tuple2<pbrt::Point2,_int> *)(in_RDI + 0xc),i);
      if (fVar4 - (float)*piVar3 < 0.0) {
        *(long *)(*in_FS_OFFSET + -0x3c8) = *(long *)(*in_FS_OFFSET + -0x3c8) + 1;
      }
      if ((Get2D()::reg == '\0') && (iVar1 = __cxa_guard_acquire(&Get2D()::reg), iVar1 != 0)) {
        Get2D()::{lambda(pbrt::StatsAccumulator&)#2}::operator_cast_to_function_pointer(local_25);
        StatRegisterer::StatRegisterer
                  (this_00,(AccumFunc)CONCAT44(i,in_stack_ffffffffffffffe8),
                   in_stack_ffffffffffffffe0);
        __cxa_guard_release(&Get2D()::reg);
      }
      *(long *)(*in_FS_OFFSET + -0x3b0) = *(long *)(*in_FS_OFFSET + -0x3b0) + 1;
      pfVar2 = Tuple2<pbrt::Point2,_float>::operator[](&local_8,i);
      fVar4 = *pfVar2;
      piVar3 = Tuple2<pbrt::Point2,_int>::operator[]((Tuple2<pbrt::Point2,_int> *)(in_RDI + 0xc),i);
      if (1.0 < fVar4 - (float)*piVar3) {
        *(long *)(*in_FS_OFFSET + -0x3b8) = *(long *)(*in_FS_OFFSET + -0x3b8) + 1;
      }
      pfVar2 = Tuple2<pbrt::Point2,_float>::operator[](&local_8,i);
      fVar4 = *pfVar2;
      piVar3 = Tuple2<pbrt::Point2,_int>::operator[]((Tuple2<pbrt::Point2,_int> *)(in_RDI + 0xc),i);
      fVar4 = Clamp<float,float,float>(fVar4 - (float)*piVar3,0.0,0.99999994);
      pfVar2 = Tuple2<pbrt::Point2,_float>::operator[](&local_8,i);
      *pfVar2 = fVar4;
    }
  }
  *(int *)(in_RDI + 0x14) = *(int *)(in_RDI + 0x14) + 2;
  return (Point2f)local_8;
}

Assistant:

PBRT_CPU_GPU
    Point2f Get2D() {
        if (dimension + 1 >= NSobolDimensions)
            dimension = 2;

        Point2f u(sampleDimension(dimension), sampleDimension(dimension + 1));
        if (dimension == 0) {
            // Remap Sobol$'$ dimensions used for pixel samples
            for (int dim = 0; dim < 2; ++dim) {
                u[dim] = u[dim] * resolution;
                CHECK_RARE(1e-7, u[dim] - pixel[dim] < 0);
                CHECK_RARE(1e-7, u[dim] - pixel[dim] > 1);
                u[dim] = Clamp(u[dim] - pixel[dim], (Float)0, OneMinusEpsilon);
            }
        }
        dimension += 2;
        return u;
    }